

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O2

SN_ELEMENT * __thiscall
ON_SerialNumberMap::FindElementHelper(ON_SerialNumberMap *this,ON__UINT64 sn)

{
  uint uVar1;
  ulong uVar2;
  SN_ELEMENT *pSVar3;
  ulong uVar4;
  ulong uVar5;
  ON_SN_BLOCK *pOVar6;
  ON_SN_BLOCK **ppOVar7;
  ulong uVar8;
  
  if (this->m_private->m_maxsn < sn) {
    return (SN_ELEMENT *)0x0;
  }
  if ((sn < 0xffffffff) && (this->m_private->m_lower_maxsn <= sn - 1)) {
    return (SN_ELEMENT *)0x0;
  }
  pOVar6 = this->m_sn_block0;
  if ((pOVar6->m_sn1 < sn) || (sn < pOVar6->m_sn0)) goto LAB_004e9d41;
  this->m_e_blk = pOVar6;
  uVar1 = pOVar6->m_purged;
  if (pOVar6->m_sorted == 0) {
    if (uVar1 != 0) {
      if (this->m_bHashTableIsValid != '\0') {
        this->m_bHashTableIsValid = '\0';
      }
      this->m_sn_count = this->m_sn_count - (ulong)uVar1;
      this->m_sn_purged = this->m_sn_purged - (ulong)uVar1;
      ON_SN_BLOCK::CullBlockHelper(pOVar6);
      UpdateMaxSNHelper(this);
      pOVar6 = this->m_sn_block0;
    }
    if (pOVar6->m_count != 0) {
      if (this->m_bHashTableIsValid != '\0') {
        this->m_bHashTableIsValid = '\0';
      }
      ON_SN_BLOCK::SortBlockHelper(pOVar6);
      goto LAB_004e9d20;
    }
LAB_004e9d24:
    if ((pOVar6->m_sn1 < sn) || (sn < pOVar6->m_sn0)) goto LAB_004e9d41;
  }
  else if (pOVar6->m_count >> (0xf < uVar1) * '\x03' + 1 < uVar1) {
    if (this->m_bHashTableIsValid != '\0') {
      this->m_bHashTableIsValid = '\0';
    }
    this->m_sn_count = this->m_sn_count - (ulong)uVar1;
    this->m_sn_purged = this->m_sn_purged - (ulong)uVar1;
    ON_SN_BLOCK::CullBlockHelper(pOVar6);
    UpdateMaxSNHelper(this);
LAB_004e9d20:
    pOVar6 = this->m_sn_block0;
    goto LAB_004e9d24;
  }
  pSVar3 = ON_SN_BLOCK::BinarySearchBlockHelper(pOVar6,sn);
  if (pSVar3 != (SN_ELEMENT *)0x0) {
    return pSVar3;
  }
LAB_004e9d41:
  if (this->m_snblk_list_count != 0) {
    ppOVar7 = this->m_snblk_list;
    uVar5 = this->m_snblk_list_count;
    while (uVar8 = uVar5, uVar8 != 0) {
      uVar5 = uVar8 >> 1;
      pOVar6 = ppOVar7[uVar5];
      uVar1 = pOVar6->m_purged;
      if (pOVar6->m_count >> (0xf < uVar1) * '\x03' + 1 < uVar1) {
        if (this->m_bHashTableIsValid != '\0') {
          this->m_bHashTableIsValid = '\0';
        }
        this->m_sn_count = this->m_sn_count - (ulong)uVar1;
        this->m_sn_purged = this->m_sn_purged - (ulong)uVar1;
        ON_SN_BLOCK::CullBlockHelper(pOVar6);
        if (pOVar6->m_count != 0) {
          UpdateMaxSNHelper(this);
          goto LAB_004e9e1b;
        }
        uVar2 = this->m_snblk_list_count;
        uVar5 = ((long)ppOVar7 - (long)this->m_snblk_list >> 3) + uVar5;
        while (uVar4 = uVar5 + 1, uVar4 < uVar2) {
          this->m_snblk_list[uVar5] = this->m_snblk_list[uVar4];
          uVar5 = uVar4;
        }
        this->m_snblk_list_count = uVar2 - 1;
        this->m_snblk_list[uVar2 - 1] = pOVar6;
        UpdateMaxSNHelper(this);
        uVar5 = uVar8 - 1;
      }
      else {
LAB_004e9e1b:
        if (pOVar6->m_sn0 <= sn) {
          if (sn <= pOVar6->m_sn1) {
            this->m_e_blk = pOVar6;
            pSVar3 = ON_SN_BLOCK::BinarySearchBlockHelper(pOVar6,sn);
            return pSVar3;
          }
          ppOVar7 = ppOVar7 + uVar5 + 1;
          uVar5 = uVar8 - (uVar5 + 1);
        }
      }
    }
  }
  return (SN_ELEMENT *)0x0;
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* ON_SerialNumberMap::FindElementHelper(ON__UINT64 sn)
{
  class ON_SN_BLOCK** eblk_array;
  class ON_SN_BLOCK* eblk;
  size_t i, j;

  if (m_private->MaxSn() < sn )
    return 0; // happens almost every time an object is added to the doc

  if (sn < UINT32_MAX && m_private->LowerMaxSn() < sn)
    return 0;

  if ( sn <= 0 )
    return 0;

  // First check m_sn_block0. For small models this
  // is the only place we need to look.
  if ( sn <= m_sn_block0.m_sn1 && m_sn_block0.m_sn0 <= sn )
  {
    SN_ELEMENT* e;

    m_e_blk = &m_sn_block0;
    if ( !m_sn_block0.m_sorted )
    {
      // m_sn_block0.m_sn[] needs to be sorted
      //
      // This is a rare occurrence.  It only happens
      // when commands add new objects in an order that
      // is different from that in which the CRhinoObject
      // class constructor was called.  In testing,
      // I could not find a real command that did this
      // and had to write TestAddBackwards to test this code.
      if ( m_sn_block0.m_purged > 0 )
      {
        // memory location for specific elements will be changed.
        // This will make the hash table invalid.
        Internal_HashTableInvalidate();
        m_sn_count -= m_sn_block0.m_purged;
        m_sn_purged -= m_sn_block0.m_purged;
        m_sn_block0.CullBlockHelper();
        UpdateMaxSNHelper();
      }
      if ( m_sn_block0.m_count > 0 )
      {
        // memory location for specific elements will be changed.
        // This will make the hash table invalid.
        Internal_HashTableInvalidate();
        m_sn_block0.SortBlockHelper();
      }
      e = ( sn <= m_sn_block0.m_sn1 && m_sn_block0.m_sn0 <= sn )
        ? m_sn_block0.BinarySearchBlockHelper(sn)
        : 0;
    }
    else if ( m_sn_block0.NeedsToBeCulled() )
    {
      // memory location for specific elements will be changed.
      // This will make the hash table invalid.
      Internal_HashTableInvalidate();
      m_sn_count -= m_sn_block0.m_purged;
      m_sn_purged -= m_sn_block0.m_purged;
      m_sn_block0.CullBlockHelper();
      UpdateMaxSNHelper();
      e = ( sn <= m_sn_block0.m_sn1 && m_sn_block0.m_sn0 <= sn )
        ? m_sn_block0.BinarySearchBlockHelper(sn)
        : 0;
    }
    else
    {
      e = m_sn_block0.BinarySearchBlockHelper(sn);
    }
    if (e)
      return e;
  }

  // look in the blocks kept in the m_sn_list[] array.
  // The m_sn[] arrays in these blocks are always sorted.
  // In addition the blocks are disjoint and stored in
  // the m_sn_list[] array in sorted order.
  if ( 0 == (i = (size_t)m_snblk_list_count) )
  {
    return 0;
  }
  eblk_array = m_snblk_list;
  while (i > 0 )
  {
    eblk = eblk_array[(j=i/2)];

    // The culling code is here rather than
    // in the binary search clause so the
    // entire ON_SerialNumberMap tends to
    // be tidy.
    if ( eblk->NeedsToBeCulled() )
    {
      // cull purged items from eblk

      // memory location for specific elements will be changed.
      // This will make the hash table invalid.
      Internal_HashTableInvalidate();

      m_sn_count -= eblk->m_purged;
      m_sn_purged -= eblk->m_purged;
      eblk->CullBlockHelper();
      if ( 0 == eblk->m_count )
      {
        // put empty block at the end of the list
        for( j += ((eblk_array-m_snblk_list)+1); j < m_snblk_list_count; j++ )
        {
          m_snblk_list[j-1] = m_snblk_list[j];
        }
        m_snblk_list_count--;
        m_snblk_list[m_snblk_list_count] = eblk;
        i--;
        UpdateMaxSNHelper();
        continue;
      }
      UpdateMaxSNHelper();
    }

    if ( sn < eblk->m_sn0 )
    {
      i = j;
    }
    else if ( sn > eblk->m_sn1 )
    {
      j++;
      eblk_array += j;
      i -= j;
    }
    else 
    {
      m_e_blk = eblk;
      return eblk->BinarySearchBlockHelper(sn);
    }
  }

  return 0;
}